

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O3

int populate_languages_metadata(MMDB_s *mmdb,MMDB_s *metadata_db,MMDB_entry_s *metadata_start)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  size_t sVar4;
  MMDB_entry_data_list_s *pMVar5;
  ulong __nmemb;
  bool bVar6;
  MMDB_entry_data_s entry_data;
  MMDB_entry_s array_start;
  MMDB_entry_data_list_s *local_80;
  MMDB_entry_data_s local_78;
  MMDB_entry_s local_40;
  
  iVar1 = MMDB_aget_value(metadata_start,&local_78,&PTR_anon_var_dwarf_1592_00108d90);
  if ((iVar1 == 0) && (iVar1 = 3, local_78.type == 0xb)) {
    local_40.offset = local_78.offset;
    local_40.mmdb = metadata_db;
    iVar1 = MMDB_get_entry_data_list(&local_40,&local_80);
    if (iVar1 == 0) {
      __nmemb = (ulong)(local_80->entry_data).data_size;
      (mmdb->metadata).languages.count = 0;
      ppcVar2 = (char **)calloc(__nmemb,8);
      (mmdb->metadata).languages.names = ppcVar2;
      if (ppcVar2 == (char **)0x0) {
        iVar1 = 5;
      }
      else if (__nmemb == 0) {
        iVar1 = 0;
      }
      else {
        sVar4 = 1;
        pMVar5 = local_80;
        do {
          pMVar5 = pMVar5->next;
          if ((pMVar5->entry_data).type != 2) {
            iVar1 = 3;
            goto LAB_001034fa;
          }
          pcVar3 = mmdb_strndup((pMVar5->entry_data).field_1.utf8_string,
                                (ulong)(pMVar5->entry_data).data_size);
          (mmdb->metadata).languages.names[sVar4 - 1] = pcVar3;
          if ((mmdb->metadata).languages.names[sVar4 - 1] == (char *)0x0) {
            iVar1 = 5;
            goto LAB_001034fa;
          }
          (mmdb->metadata).languages.count = sVar4;
          bVar6 = sVar4 != __nmemb;
          sVar4 = sVar4 + 1;
        } while (bVar6);
        iVar1 = 0;
LAB_001034fa:
        if (local_80 == (MMDB_entry_data_list_s *)0x0) {
          return iVar1;
        }
      }
      data_pool_destroy((MMDB_data_pool_s *)local_80->pool);
    }
  }
  return iVar1;
}

Assistant:

static int populate_languages_metadata(MMDB_s *mmdb,
                                       MMDB_s *metadata_db,
                                       MMDB_entry_s *metadata_start) {
    MMDB_entry_data_s entry_data;

    const char *path[] = {"languages", NULL};
    int status = MMDB_aget_value(metadata_start, &entry_data, path);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (MMDB_DATA_TYPE_ARRAY != entry_data.type) {
        return MMDB_INVALID_METADATA_ERROR;
    }

    MMDB_entry_s array_start = {.mmdb = metadata_db,
                                .offset = entry_data.offset};

    MMDB_entry_data_list_s *member;
    status = MMDB_get_entry_data_list(&array_start, &member);
    if (MMDB_SUCCESS != status) {
        return status;
    }

    MMDB_entry_data_list_s *first_member = member;

    uint32_t array_size = member->entry_data.data_size;
    MAYBE_CHECK_SIZE_OVERFLOW(
        array_size, SIZE_MAX / sizeof(char *), MMDB_INVALID_METADATA_ERROR);

    mmdb->metadata.languages.count = 0;
    mmdb->metadata.languages.names = calloc(array_size, sizeof(char *));
    if (NULL == mmdb->metadata.languages.names) {
        MMDB_free_entry_data_list(first_member);
        return MMDB_OUT_OF_MEMORY_ERROR;
    }

    for (uint32_t i = 0; i < array_size; i++) {
        member = member->next;
        if (MMDB_DATA_TYPE_UTF8_STRING != member->entry_data.type) {
            MMDB_free_entry_data_list(first_member);
            return MMDB_INVALID_METADATA_ERROR;
        }

        mmdb->metadata.languages.names[i] = mmdb_strndup(
            member->entry_data.utf8_string, member->entry_data.data_size);

        if (NULL == mmdb->metadata.languages.names[i]) {
            MMDB_free_entry_data_list(first_member);
            return MMDB_OUT_OF_MEMORY_ERROR;
        }
        // We assign this as we go so that if we fail a calloc and need to
        // free it, the count is right.
        mmdb->metadata.languages.count = i + 1;
    }

    MMDB_free_entry_data_list(first_member);

    return MMDB_SUCCESS;
}